

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::cov(Group *this,View *view)

{
  _Mem *this_00;
  __node_base *p_Var1;
  
  p_Var1 = &(this->viewing_groups)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    if (*(char *)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor == '\x01') {
      this_00 = (_Mem *)r_code::Mem::Get();
      _Mem::inject_copy(this_00,view,(Group *)p_Var1[1]._M_nxt);
    }
  }
  return;
}

Assistant:

void Group::cov(View *view)
{
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second) { // cov==true, viewing group c-salient and c-active (otherwise it wouldn't be a viewing group).
            _Mem::Get()->inject_copy(view, vg->first);
        }
    }
}